

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConditionalExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConditionalExpression,slang::ast::Type_const&,nonstd::span_lite::span<slang::ast::ConditionalExpression::Condition,18446744073709551615ul>,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
          (BumpAllocator *this,Type *args,
          span<slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *args_1,
          Expression *args_2,Expression *args_3,SourceRange *args_4)

{
  span<slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *type;
  ConditionalExpression *this_00;
  span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> local_48;
  SourceRange *local_38;
  SourceRange *args_local_4;
  Expression *args_local_3;
  Expression *args_local_2;
  span<slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *args_local_1;
  Type *args_local;
  BumpAllocator *this_local;
  
  local_38 = args_4;
  args_local_4 = (SourceRange *)args_3;
  args_local_3 = args_2;
  args_local_2 = (Expression *)args_1;
  args_local_1 = (span<slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *)args;
  args_local = (Type *)this;
  this_00 = (ConditionalExpression *)allocate(this,0x50,8);
  type = args_local_1;
  nonstd::span_lite::
  span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>::
  span<slang::ast::ConditionalExpression::Condition,_18446744073709551615UL,_0>
            (&local_48,
             (span<slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *)
             args_local_2);
  ast::ConditionalExpression::ConditionalExpression
            (this_00,(Type *)type,local_48,args_local_3,(Expression *)args_local_4,*local_38);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }